

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Designator_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Designator_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Designator_PDU *this)

{
  ostream *poVar1;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KStringStream ss;
  KString local_2a0;
  KString local_280;
  KString local_260;
  KString local_240;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,&this->super_Header);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-Designator PDU-\n");
  poVar1 = std::operator<<(poVar1,"Designating Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_200,&this->m_DesignatingEntityID);
  UTILS::IndentString(&local_1e0,&local_200,Tabs,in_CL);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"Code Name:                   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16CodeName);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Designated Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_240,&this->m_DesignatedEntityID);
  UTILS::IndentString(&local_220,&local_240,Tabs_00,in_CL);
  poVar1 = std::operator<<(poVar1,(string *)&local_220);
  poVar1 = std::operator<<(poVar1,"Code:                        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16Code);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Power(watts):                ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32Power);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Wave Length(microns):        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32WaveLength);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Spot Location(Entity):       ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_260,&this->m_SpotRegardsToEntity);
  poVar1 = std::operator<<(poVar1,(string *)&local_260);
  poVar1 = std::operator<<(poVar1,"Spot World Location:         ");
  DATA_TYPE::WorldCoordinates::GetAsString_abi_cxx11_(&local_280,&this->m_SpotLocation);
  poVar1 = std::operator<<(poVar1,(string *)&local_280);
  poVar1 = std::operator<<(poVar1,"Dead Reckoning Algorithm:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8DeadReckoningAlgorithm);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Entity Linear Acceleration:  ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_2a0,&this->m_EntityLinearAcceleration);
  std::operator<<(poVar1,(string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Designator_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Designator PDU-\n"
       << "Designating Entity ID:\n"
       << IndentString( m_DesignatingEntityID.GetAsString(), 1 )
       << "Code Name:                   " << m_ui16CodeName                            << "\n"
       << "Designated Entity ID:\n"
       << IndentString( m_DesignatedEntityID.GetAsString(), 1 )
       << "Code:                        " << m_ui16Code                                << "\n"
       << "Power(watts):                " << m_f32Power                                << "\n"
       << "Wave Length(microns):        " << m_f32WaveLength                           << "\n"
       << "Spot Location(Entity):       " << m_SpotRegardsToEntity.GetAsString()
       << "Spot World Location:         " << m_SpotLocation.GetAsString()
       << "Dead Reckoning Algorithm:    " << ( KUINT16 )m_ui8DeadReckoningAlgorithm    << "\n"
       << "Entity Linear Acceleration:  " << m_EntityLinearAcceleration.GetAsString();

    return ss.str();
}